

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_write_plain(Curl_easy *data,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written
                         )

{
  undefined8 in_RAX;
  ssize_t sVar1;
  CURLcode result;
  CURLcode local_14;
  
  local_14 = (CURLcode)((ulong)in_RAX >> 0x20);
  sVar1 = Curl_send_plain(data,(uint)(data->conn->sock[1] == sockfd),mem,len,&local_14);
  *written = sVar1;
  return local_14;
}

Assistant:

CURLcode Curl_write_plain(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          const void *mem,
                          size_t len,
                          ssize_t *written)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  int num;
  DEBUGASSERT(conn);
  num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *written = Curl_send_plain(data, num, mem, len, &result);

  return result;
}